

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

duration<double,_std::ratio<1L,_1L>_>
bench_cpp(int n,string_view path,string_view fname,bool verbose)

{
  duration<double,_std::ratio<1L,_1L>_> dVar1;
  string_view w;
  string_view func;
  string_view path_00;
  iterator iVar2;
  variant_alternative_t<1UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool>_>
  *pvVar3;
  ostream *poVar4;
  variant_alternative_t<0UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool>_>
  *pvVar5;
  long lVar6;
  undefined8 uVar7;
  undefined7 in_register_00000089;
  bool bVar8;
  undefined4 uVar9;
  undefined8 unaff_R12;
  int iVar10;
  long lVar11;
  bool bVar12;
  string h;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  fs_function_map;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  result;
  duration<double,_std::ratio<1L,_1L>_> local_478;
  undefined1 local_469;
  key_type local_468;
  undefined4 local_454;
  size_t local_450;
  char *local_448;
  size_t local_440;
  char *local_438;
  undefined4 local_42c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  size_t local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_400;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3f8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_3c0;
  code *local_3a0;
  code *local_398;
  undefined8 local_390;
  char *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  code *local_370;
  code *local_368;
  undefined8 local_360;
  char *local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  code *local_340;
  code *local_338;
  undefined8 local_330;
  char *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  code *local_310;
  code *local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  code *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  code *local_280;
  code *local_278;
  undefined8 local_270;
  char *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  code *local_250;
  code *local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  code *local_220;
  code *local_218;
  undefined8 local_210;
  char *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  code *local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  code *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  code *local_190;
  code *local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  code *local_160;
  code *local_158;
  undefined8 local_150;
  char *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  code *local_130;
  code *local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  code *local_100;
  code *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  code *local_d0;
  code *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  code *local_a0;
  code *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  code *local_70;
  code *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40 [2];
  
  local_468._M_str = fname._M_str;
  local_468._M_len = fname._M_len;
  local_448 = path._M_str;
  local_450 = path._M_len;
  local_3c0._0_8_ = 9;
  local_3c0._8_8_ = (long)"fs_canonical" + 3;
  local_3c0._16_8_ = 0;
  local_3c0._24_8_ = 0;
  local_398 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:44:17)>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:44:17)>
              ::_M_manager;
  local_390 = 7;
  local_388 = "resolve";
  local_380 = 0;
  uStack_378 = 0;
  local_368 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:45:15)>
              ::_M_invoke;
  local_370 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:45:15)>
              ::_M_manager;
  local_360 = 10;
  local_358 = "drop_slash";
  local_350 = 0;
  uStack_348 = 0;
  local_338 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:46:18)>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:46:18)>
              ::_M_manager;
  local_330 = 6;
  local_328 = "parent";
  local_320 = 0;
  uStack_318 = 0;
  local_308 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:47:14)>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:47:14)>
              ::_M_manager;
  local_300 = 9;
  local_2f8 = "file_name";
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2d8 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:48:17)>
              ::_M_invoke;
  local_2e0 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:48:17)>
              ::_M_manager;
  local_2d0 = 6;
  local_2c8 = "suffix";
  local_2c0 = 0;
  uStack_2b8 = 0;
  local_2a8 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:49:14)>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:49:14)>
              ::_M_manager;
  local_2a0 = 6;
  local_298 = "normal";
  local_290 = 0;
  uStack_288 = 0;
  local_278 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:50:14)>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:50:14)>
              ::_M_manager;
  local_270 = 8;
  local_268 = "reserved";
  local_260 = 0;
  uStack_258 = 0;
  local_248 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:51:16)>
              ::_M_invoke;
  local_250 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:51:16)>
              ::_M_manager;
  local_240 = 6;
  local_238 = "exists";
  local_230 = 0;
  uStack_228 = 0;
  local_218 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:52:14)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:52:14)>
              ::_M_manager;
  local_210 = 6;
  local_208 = "is_dir";
  local_200 = 0;
  uStack_1f8 = 0;
  local_1e8 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:53:14)>
              ::_M_invoke;
  local_1f0 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:53:14)>
              ::_M_manager;
  local_1e0 = 7;
  local_1d8 = "is_char";
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1b8 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:54:15)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:54:15)>
              ::_M_manager;
  local_1b0 = 7;
  local_1a8 = "is_file";
  local_1a0 = 0;
  uStack_198 = 0;
  local_188 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:55:15)>
              ::_M_invoke;
  local_190 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:55:15)>
              ::_M_manager;
  local_180 = 10;
  local_178 = "is_symlink";
  local_170 = 0;
  uStack_168 = 0;
  local_158 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:56:18)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:56:18)>
              ::_M_manager;
  local_150 = 0xc;
  local_148 = "read_symlink";
  local_140 = 0;
  uStack_138 = 0;
  local_128 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:57:20)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:57:20)>
              ::_M_manager;
  local_120 = 5;
  local_118 = "which";
  local_110 = 0;
  uStack_108 = 0;
  local_f8 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:58:13)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:58:13)>
              ::_M_manager;
  local_f0 = 7;
  local_e8 = "homedir";
  local_e0 = 0;
  uStack_d8 = 0;
  local_c8 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:59:15)>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:59:15)>
             ::_M_manager;
  local_c0 = 10;
  local_b8 = "expanduser";
  local_b0 = 0;
  uStack_a8 = 0;
  local_98 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:60:18)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:60:18)>
             ::_M_manager;
  local_90 = 3;
  local_88 = "cwd";
  local_80 = 0;
  uStack_78 = 0;
  local_68 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:61:11)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:61:11)>
             ::_M_manager;
  local_60 = 0xb;
  local_58 = "is_reserved";
  local_50 = 0;
  uStack_48 = 0;
  local_40[1] = std::
                _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:62:19)>
                ::_M_invoke;
  local_40[0] = std::
                _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:62:19)>
                ::_M_manager;
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>const*>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_3f8,&local_3c0,&stack0xffffffffffffffd0,0,&local_428,&local_440,&local_469);
  lVar11 = 0;
  do {
    if (*(code **)((long)local_40 + lVar11) != (code *)0x0) {
      (**(code **)((long)local_40 + lVar11))((long)&local_50 + lVar11,(long)&local_50 + lVar11,3);
    }
    lVar11 = lVar11 + -0x30;
  } while (lVar11 != -0x390);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3f8,&local_468);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: unknown function ",0x18);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_468._M_str,local_468._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  else {
    local_440 = local_450;
    local_438 = local_448;
    if (*(long *)((long)iVar2.
                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                        ._M_cur + 0x28) == 0) {
LAB_00106762:
      uVar7 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar7);
    }
    (**(code **)((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                       ._M_cur + 0x30))
              (&local_3c0,
               (long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                     ._M_cur + 0x18,&local_440);
    if ((char)local_3a0 == '\0') {
      pvVar5 = std::get<0ul,std::__cxx11::string,bool>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                           *)&local_3c0._M_first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_428,pvVar5);
      if (local_428._M_string_length == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_468._M_str,local_468._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_448,local_450);
        bVar8 = false;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," failed on warmup\n",0x12);
        uVar9 = 0;
      }
      else {
        bVar8 = true;
        uVar9 = 0;
      }
    }
    else {
      pvVar3 = std::get<1ul,std::__cxx11::string,bool>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                           *)&local_3c0._M_first);
      uVar9 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),*pvVar3);
      bVar8 = true;
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_&>
      ::_S_vtable._M_arr[(ulong)local_3a0 & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)&local_440,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                *)&local_3c0._M_first);
    if (bVar8) {
      local_42c = (undefined4)CONCAT71(in_register_00000089,verbose);
      bVar8 = n < 1;
      local_454 = uVar9;
      if (n < 1) {
        local_478.__r = 1.79769313486232e+308;
      }
      else {
        local_478.__r = 1.79769313486232e+308;
        iVar10 = 1;
        do {
          lVar11 = std::chrono::_V2::steady_clock::now();
          iVar2 = std::
                  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_3f8,&local_468);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: unknown function ",0x18);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_468._M_str,local_468._M_len);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            dVar1.__r = local_478.__r;
          }
          else {
            local_440 = local_450;
            local_438 = local_448;
            if (*(long *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                                ._M_cur + 0x28) == 0) {
              std::__throw_bad_function_call();
              goto LAB_00106762;
            }
            (**(code **)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                               ._M_cur + 0x30))
                      (&local_3c0,
                       (long)iVar2.
                             super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                             ._M_cur + 0x18,&local_440);
            if ((char)local_3a0 == '\0') {
              pvVar5 = std::get<0ul,std::__cxx11::string,bool>
                                 ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                                   *)&local_3c0._M_first);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_428,pvVar5);
            }
            else {
              pvVar3 = std::get<1ul,std::__cxx11::string,bool>
                                 ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                                   *)&local_3c0._M_first);
              local_454 = (undefined4)CONCAT71((int7)((ulong)pvVar3 >> 8),*pvVar3);
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_&>
              ::_S_vtable._M_arr[(ulong)local_3a0 & 0xff]._M_data)
                      ((anon_class_1_0_00000001 *)&local_440,
                       (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                        *)&local_3c0._M_first);
            lVar6 = std::chrono::_V2::steady_clock::now();
            dVar1.__r = (double)(lVar6 - lVar11) / 1000000000.0;
            if (local_478.__r <= dVar1.__r) {
              dVar1.__r = local_478.__r;
            }
          }
          local_478.__r = dVar1.__r;
          if (iVar2.
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
              ._M_cur == (__node_type *)0x0) break;
          bVar8 = n <= iVar10;
          bVar12 = iVar10 != n;
          iVar10 = iVar10 + 1;
        } while (bVar12);
      }
      if ((bVar8 & (byte)local_42c) == 1) {
        func._M_str = local_468._M_str;
        func._M_len = local_468._M_len;
        local_408 = local_428._M_string_length;
        paStack_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_428._M_dataplus._M_p;
        path_00._M_str = local_448;
        path_00._M_len = local_450;
        w._M_str = local_428._M_dataplus._M_p;
        w._M_len = local_428._M_string_length;
        print_cpp(local_478,n,path_00,func,w,(bool)((byte)local_454 & 1));
      }
      goto LAB_0010669f;
    }
  }
  local_478.__r = 1.79769313486232e+308;
LAB_0010669f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_3f8);
  return (duration<double,_std::ratio<1L,_1L>_>)local_478.__r;
}

Assistant:

std::chrono::duration<double> bench_cpp(int n, std::string_view path, std::string_view fname, bool verbose)
{

auto t = std::chrono::duration<double>::max();

constexpr bool strict = false;
constexpr bool expand_tilde = false;

using fs_function = std::function<std::variant<std::string, bool>(std::string_view)>;

std::unordered_map<std::string_view, fs_function> fs_function_map = {
  {"canonical", [=](std::string_view p) { return fs_canonical(p, strict, expand_tilde); }},
  {"resolve", [=](std::string_view p) { return fs_resolve(p, strict, expand_tilde); }},
  {"drop_slash", [](std::string_view p) { return fs_drop_slash(p); }},
  {"parent", [](std::string_view p) { return fs_parent(p); }},
  {"file_name", [](std::string_view p) { return fs_file_name(p); }},
  {"suffix", [](std::string_view p) { return fs_suffix(p); }},
  {"normal", [](std::string_view p) { return fs_normal(p); }},
  {"reserved", [](std::string_view p) { return fs_is_reserved(p); }},
  {"exists", [](std::string_view p) { return fs_exists(p); }},
  {"is_dir", [](std::string_view p) { return fs_is_dir(p); }},
  {"is_char", [](std::string_view p) { return fs_is_char_device(p); }},
  {"is_file", [](std::string_view p) { return fs_is_file(p); }},
  {"is_symlink", [](std::string_view p) { return fs_is_symlink(p); }},
  {"read_symlink", [](std::string_view p) { return fs_read_symlink(p); }},
  {"which", [](std::string_view p) { return fs_which(p); }},
  {"homedir", [](std::string_view) { return fs_get_homedir(); }},
  {"expanduser", [](std::string_view p) { return fs_expanduser(p); }},
  {"cwd", [](std::string_view) { return fs_get_cwd(); }},
  {"is_reserved", [](std::string_view p) { return fs_is_reserved(p); }}
};

// warmup
std::string h;
bool b = false;

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result)){
      h = std::get<std::string>(result);
      if(h.empty()){
        std::cerr << "ERROR: " << fname << " " << path << " failed on warmup\n";
        return t;
      }
    } else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

for (int i = 0; i < n; ++i)
{
  auto t0 = std::chrono::steady_clock::now();

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result))
      h = std::get<std::string>(result);
    else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

  auto t1 = std::chrono::steady_clock::now();
  t = std::min(t, std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t0));
}

if(verbose)
  print_cpp(t, n, path, fname, h, b);

return t;
}